

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::UnixTaskRunner::UnixTaskRunner(UnixTaskRunner *this)

{
  PlatformThreadId PVar1;
  uint uVar2;
  anon_class_1_0_00000001 local_41;
  function<void_()> local_40;
  UnixTaskRunner *local_10;
  UnixTaskRunner *this_local;
  
  local_10 = this;
  TaskRunner::TaskRunner(&this->super_TaskRunner);
  (this->super_TaskRunner)._vptr_TaskRunner = (_func_int **)&PTR__UnixTaskRunner_009c0860;
  ThreadChecker::ThreadChecker(&this->thread_checker_);
  PVar1 = GetThreadId();
  this->created_thread_id_ = PVar1;
  EventFd::EventFd(&this->event_);
  std::vector<pollfd,_std::allocator<pollfd>_>::vector(&this->poll_fds_);
  std::mutex::mutex(&this->lock_);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::deque
            (&this->immediate_tasks_);
  std::
  multimap<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::function<void_()>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::function<void_()>_>_>_>
  ::multimap(&this->delayed_tasks_);
  this->quit_ = false;
  std::
  map<int,_perfetto::base::UnixTaskRunner::WatchTask,_std::less<int>,_std::allocator<std::pair<const_int,_perfetto::base::UnixTaskRunner::WatchTask>_>_>
  ::map(&this->watch_tasks_);
  this->watch_tasks_changed_ = false;
  uVar2 = EventFd::fd(&this->event_);
  ::std::function<void()>::function<perfetto::base::UnixTaskRunner::UnixTaskRunner()::__0,void>
            ((function<void()> *)&local_40,&local_41);
  (*(this->super_TaskRunner)._vptr_TaskRunner[4])(this,(ulong)uVar2,&local_40);
  ::std::function<void_()>::~function(&local_40);
  return;
}

Assistant:

UnixTaskRunner::UnixTaskRunner() {
  AddFileDescriptorWatch(event_.fd(), [] {
    // Not reached -- see PostFileDescriptorWatches().
    PERFETTO_DFATAL("Should be unreachable.");
  });
}